

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

bool __thiscall CGameControllerCTF::DoWincheckMatch(CGameControllerCTF *this)

{
  int iVar1;
  int iVar2;
  IServer *pIVar3;
  int iVar4;
  IGameController *in_RDI;
  
  if (((in_RDI->m_GameInfo).m_ScoreLimit < 1) ||
     ((in_RDI->m_aTeamscore[0] < (in_RDI->m_GameInfo).m_ScoreLimit &&
      (in_RDI->m_aTeamscore[1] < (in_RDI->m_GameInfo).m_ScoreLimit)))) {
    if ((in_RDI->m_GameInfo).m_TimeLimit < 1) {
      return false;
    }
    pIVar3 = IGameController::Server(in_RDI);
    iVar1 = IServer::Tick(pIVar3);
    iVar1 = iVar1 - in_RDI->m_GameStartTick;
    iVar4 = (in_RDI->m_GameInfo).m_TimeLimit;
    pIVar3 = IGameController::Server(in_RDI);
    iVar2 = IServer::TickSpeed(pIVar3);
    iVar4 = iVar4 * iVar2;
    if (SBORROW4(iVar1,iVar4 * 0x3c) != iVar1 + iVar4 * -0x3c < 0) {
      return false;
    }
  }
  if (in_RDI->m_SuddenDeath == 0) {
    if (in_RDI->m_aTeamscore[0] != in_RDI->m_aTeamscore[1]) {
      IGameController::EndMatch((IGameController *)0x12d1dc);
      return true;
    }
    in_RDI->m_SuddenDeath = 1;
  }
  else if (in_RDI->m_aTeamscore[0] / 100 != in_RDI->m_aTeamscore[1] / 100) {
    IGameController::EndMatch((IGameController *)0x12d1b6);
    return true;
  }
  return false;
}

Assistant:

bool CGameControllerCTF::DoWincheckMatch()
{
	// check score win condition
	if((m_GameInfo.m_ScoreLimit > 0 && (m_aTeamscore[TEAM_RED] >= m_GameInfo.m_ScoreLimit || m_aTeamscore[TEAM_BLUE] >= m_GameInfo.m_ScoreLimit)) ||
		(m_GameInfo.m_TimeLimit > 0 && (Server()->Tick()-m_GameStartTick) >= m_GameInfo.m_TimeLimit*Server()->TickSpeed()*60))
	{
		if(m_SuddenDeath)
		{
			if(m_aTeamscore[TEAM_RED]/100 != m_aTeamscore[TEAM_BLUE]/100)
			{
				EndMatch();
				return true;
			}
		}
		else
		{
			if(m_aTeamscore[TEAM_RED] != m_aTeamscore[TEAM_BLUE])
			{
				EndMatch();
				return true;
			}
			else
				m_SuddenDeath = 1;
		}
	}
	return false;
}